

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_pipe_recv_cancel(nni_aio *aio,void *arg,int rv)

{
  long lVar1;
  int iVar2;
  udp_ep *ep;
  udp_pipe *p;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  lVar1 = *arg;
  nni_mtx_lock((nni_mtx *)(lVar1 + 8));
  iVar2 = nni_aio_list_active(aio);
  if (iVar2 == 0) {
    nni_mtx_unlock((nni_mtx *)(lVar1 + 8));
  }
  else {
    nni_aio_list_remove(aio);
    nni_mtx_unlock((nni_mtx *)(lVar1 + 8));
    nni_aio_finish_error(aio,rv);
  }
  return;
}

Assistant:

static void
udp_pipe_recv_cancel(nni_aio *aio, void *arg, int rv)
{
	udp_pipe *p  = arg;
	udp_ep   *ep = p->ep;

	nni_mtx_lock(&ep->mtx);
	if (!nni_aio_list_active(aio)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	nni_aio_list_remove(aio);
	nni_mtx_unlock(&ep->mtx);
	nni_aio_finish_error(aio, rv);
}